

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O0

void __thiscall google::protobuf::compiler::python::Generator::PrintTopLevelEnums(Generator *this)

{
  Printer *pPVar1;
  int iVar2;
  int iVar3;
  string *psVar4;
  ulong uVar5;
  size_type sVar6;
  reference value1;
  reference pvVar7;
  int i_00;
  string local_c8;
  int local_a8;
  int local_a4;
  int i_1;
  EnumValueDescriptor *local_78;
  EnumValueDescriptor *value_descriptor;
  undefined1 local_68 [4];
  int j;
  EnumDescriptor *local_48;
  EnumDescriptor *enum_descriptor;
  int local_2c;
  undefined1 local_28 [4];
  int i;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  top_level_enum_values;
  Generator *this_local;
  
  top_level_enum_values.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            *)local_28);
  local_2c = 0;
  while( true ) {
    iVar2 = local_2c;
    iVar3 = FileDescriptor::enum_type_count(this->file_);
    if (iVar3 <= iVar2) break;
    local_48 = FileDescriptor::enum_type(this->file_,local_2c);
    PrintEnum(this,local_48);
    pPVar1 = this->printer_;
    psVar4 = EnumDescriptor::name_abi_cxx11_(local_48);
    ModuleLevelDescriptorName<google::protobuf::EnumDescriptor>((string *)local_68,this,local_48);
    io::Printer::Print(pPVar1,"$name$ = enum_type_wrapper.EnumTypeWrapper($descriptor_name$)","name"
                       ,psVar4,"descriptor_name",(string *)local_68);
    std::__cxx11::string::~string((string *)local_68);
    io::Printer::Print(this->printer_,"\n");
    value_descriptor._4_4_ = 0;
    while( true ) {
      iVar2 = value_descriptor._4_4_;
      iVar3 = EnumDescriptor::value_count(local_48);
      if (iVar3 <= iVar2) break;
      local_78 = EnumDescriptor::value(local_48,value_descriptor._4_4_);
      psVar4 = EnumValueDescriptor::name_abi_cxx11_(local_78);
      local_a4 = EnumValueDescriptor::number(local_78);
      std::make_pair<std::__cxx11::string_const&,int>
                ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                  *)&i_1,psVar4,&local_a4);
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ::push_back((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   *)local_28,(value_type *)&i_1);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
      ~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
             *)&i_1);
      value_descriptor._4_4_ = value_descriptor._4_4_ + 1;
    }
    local_2c = local_2c + 1;
  }
  local_a8 = 0;
  while( true ) {
    uVar5 = (ulong)local_a8;
    sVar6 = std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::size((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    *)local_28);
    if (sVar6 <= uVar5) break;
    pPVar1 = this->printer_;
    value1 = std::
             vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                           *)local_28,(long)local_a8);
    pvVar7 = std::
             vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                           *)local_28,(long)local_a8);
    SimpleItoa_abi_cxx11_(&local_c8,(protobuf *)(ulong)(uint)pvVar7->second,i_00);
    io::Printer::Print(pPVar1,"$name$ = $value$\n","name",&value1->first,"value",&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    local_a8 = local_a8 + 1;
  }
  io::Printer::Print(this->printer_,"\n");
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             *)local_28);
  return;
}

Assistant:

void Generator::PrintTopLevelEnums() const {
  std::vector<std::pair<string, int> > top_level_enum_values;
  for (int i = 0; i < file_->enum_type_count(); ++i) {
    const EnumDescriptor& enum_descriptor = *file_->enum_type(i);
    PrintEnum(enum_descriptor);
    printer_->Print("$name$ = "
                    "enum_type_wrapper.EnumTypeWrapper($descriptor_name$)",
                    "name", enum_descriptor.name(),
                    "descriptor_name",
                    ModuleLevelDescriptorName(enum_descriptor));
    printer_->Print("\n");

    for (int j = 0; j < enum_descriptor.value_count(); ++j) {
      const EnumValueDescriptor& value_descriptor = *enum_descriptor.value(j);
      top_level_enum_values.push_back(
          std::make_pair(value_descriptor.name(), value_descriptor.number()));
    }
  }

  for (int i = 0; i < top_level_enum_values.size(); ++i) {
    printer_->Print("$name$ = $value$\n",
                    "name", top_level_enum_values[i].first,
                    "value", SimpleItoa(top_level_enum_values[i].second));
  }
  printer_->Print("\n");
}